

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

Context_conflict2 *
build_context(char *filename,char *source,uint sourcelen,MOJOSHADER_preprocessorDefine *defines,
             uint define_count,MOJOSHADER_includeOpen include_open,
             MOJOSHADER_includeClose include_close,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  Context_conflict2 *ctx_00;
  Buffer *pBVar1;
  ErrorList *pEVar2;
  Preprocessor *pPVar3;
  size_t mapblk;
  size_t outblk;
  Context_conflict2 *ctx;
  MOJOSHADER_includeOpen include_open_local;
  uint define_count_local;
  MOJOSHADER_preprocessorDefine *defines_local;
  uint sourcelen_local;
  char *source_local;
  char *filename_local;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  if (f == (MOJOSHADER_free)0x0) {
    f = MOJOSHADER_internal_free;
  }
  ctx = (Context_conflict2 *)include_open;
  if (include_open == (MOJOSHADER_includeOpen)0x0) {
    ctx = (Context_conflict2 *)MOJOSHADER_internal_include_open;
  }
  if (include_close == (MOJOSHADER_includeClose)0x0) {
    include_close = MOJOSHADER_internal_include_close;
  }
  ctx_00 = (Context_conflict2 *)(*m)(0xf8,d);
  if (ctx_00 != (Context_conflict2 *)0x0) {
    memset(ctx_00,0,0xf8);
    ctx_00->malloc = m;
    ctx_00->free = f;
    ctx_00->malloc_data = d;
    ctx_00->current_position = -2;
    pBVar1 = buffer_create(0x400,MallocBridge,FreeBridge,ctx_00);
    ctx_00->output = pBVar1;
    if (ctx_00->output != (Buffer *)0x0) {
      pBVar1 = buffer_create(0x1000,MallocBridge,FreeBridge,ctx_00);
      ctx_00->token_to_source = pBVar1;
      if (ctx_00->token_to_source != (Buffer *)0x0) {
        pEVar2 = errorlist_create(MallocBridge,FreeBridge,ctx_00);
        ctx_00->errors = pEVar2;
        if (ctx_00->errors != (ErrorList *)0x0) {
          pPVar3 = preprocessor_start(filename,source,sourcelen,(MOJOSHADER_includeOpen)ctx,
                                      include_close,defines,define_count,1,MallocBridge,FreeBridge,
                                      ctx_00);
          ctx_00->preprocessor = pPVar3;
          if (ctx_00->preprocessor != (Preprocessor *)0x0) {
            return ctx_00;
          }
        }
      }
    }
    destroy_context(ctx_00);
  }
  return (Context_conflict2 *)0x0;
}

Assistant:

static Context *build_context(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    if (!m) m = MOJOSHADER_internal_malloc;
    if (!f) f = MOJOSHADER_internal_free;

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    //ctx->parse_phase = MOJOSHADER_PARSEPHASE_NOTSTARTED;
    create_symbolmap(ctx, &ctx->usertypes); // !!! FIXME: check for failure.
    create_symbolmap(ctx, &ctx->variables); // !!! FIXME: check for failure.
    ctx->strcache = stringcache_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.
    ctx->errors = errorlist_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.
    ctx->warnings = errorlist_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.

    // !!! FIXME: this feels hacky.
    ctx->garbage = buffer_create(256*sizeof(void*),MallocBridge,FreeBridge,ctx);  // !!! FIXME: check for failure.

    ctx->dt_none.type = MOJOSHADER_AST_DATATYPE_NONE;
    ctx->dt_bool.type = MOJOSHADER_AST_DATATYPE_BOOL;
    ctx->dt_int.type = MOJOSHADER_AST_DATATYPE_INT;
    ctx->dt_uint.type = MOJOSHADER_AST_DATATYPE_UINT;
    ctx->dt_float.type = MOJOSHADER_AST_DATATYPE_FLOAT;
    ctx->dt_float_snorm.type = MOJOSHADER_AST_DATATYPE_FLOAT_SNORM;
    ctx->dt_float_unorm.type = MOJOSHADER_AST_DATATYPE_FLOAT_UNORM;
    ctx->dt_half.type = MOJOSHADER_AST_DATATYPE_HALF;
    ctx->dt_double.type = MOJOSHADER_AST_DATATYPE_DOUBLE;
    ctx->dt_string.type = MOJOSHADER_AST_DATATYPE_STRING;
    ctx->dt_sampler1d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_1D;
    ctx->dt_sampler2d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_2D;
    ctx->dt_sampler3d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_3D;
    ctx->dt_samplercube.type = MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE;
    ctx->dt_samplerstate.type = MOJOSHADER_AST_DATATYPE_SAMPLER_STATE;
    ctx->dt_samplercompstate.type = MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE;

    #define INIT_DT_BUFFER(t) \
        ctx->dt_buf_##t.type = MOJOSHADER_AST_DATATYPE_BUFFER; \
        ctx->dt_buf_##t.buffer.base = &ctx->dt_##t;
    INIT_DT_BUFFER(bool);
    INIT_DT_BUFFER(int);
    INIT_DT_BUFFER(uint);
    INIT_DT_BUFFER(half);
    INIT_DT_BUFFER(float);
    INIT_DT_BUFFER(double);
    INIT_DT_BUFFER(float_snorm);
    INIT_DT_BUFFER(float_unorm);
    #undef INIT_DT_BUFFER

    return ctx;
}